

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O3

llb_buildsystem_command_result_t
anon_unknown.dwarf_98ca::depinfo_tester_command_execute_command
          (void *context,llb_buildsystem_command_t *command,llb_buildsystem_interface_t *bi,
          llb_task_interface_t ti,llb_buildsystem_queue_job_context_t *job)

{
  string path;
  string path_00;
  string path_01;
  string path_02;
  char *ptr_00;
  char *pcVar1;
  llb_buildsystem_command_result_t lVar2;
  string indirectInputPath;
  string indirectContents;
  string depInfoPath;
  string outputPath;
  string depInfoContents;
  string directInputPath;
  char *ptr;
  _Alloc_hider in_stack_fffffffffffffe28;
  size_type in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  string local_1b8;
  long *local_198;
  long local_190;
  long local_188 [2];
  long *local_178;
  long local_170;
  long local_168 [2];
  undefined1 *local_158;
  long local_150;
  undefined1 local_148;
  undefined7 uStack_147;
  long *local_138;
  long local_130;
  long local_128 [2];
  string *local_118 [2];
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e8 [16];
  undefined1 local_d8 [24];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  ptr_00 = llb_buildsystem_command_get_description(command);
  local_d8._0_8_ = ptr_00;
  llbuild::basic::sys::strsep((char **)local_d8,"|");
  pcVar1 = llbuild::basic::sys::strsep((char **)local_d8,"|");
  std::__cxx11::string::string((string *)&local_138,pcVar1,(allocator *)&local_178);
  puts((char *)local_138);
  pcVar1 = llbuild::basic::sys::strsep((char **)local_d8,"|");
  std::__cxx11::string::string((string *)&local_178,pcVar1,(allocator *)&local_198);
  puts((char *)local_178);
  pcVar1 = llbuild::basic::sys::strsep((char **)local_d8,"|");
  std::__cxx11::string::string((string *)&local_198,pcVar1,(allocator *)&stack0xfffffffffffffe28);
  puts((char *)local_198);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,local_138,(long)local_138 + local_130);
  path._M_string_length = in_stack_fffffffffffffe30;
  path._M_dataplus._M_p = in_stack_fffffffffffffe28._M_p;
  path.field_2._M_allocated_capacity = in_stack_fffffffffffffe38;
  path.field_2._8_8_ = in_stack_fffffffffffffe40;
  readFileContents((string *)&stack0xfffffffffffffe28,path);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (in_stack_fffffffffffffe30 == 0) {
    lVar2 = llb_buildsystem_command_result_failed;
  }
  else {
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,in_stack_fffffffffffffe28._M_p,
               in_stack_fffffffffffffe28._M_p + in_stack_fffffffffffffe30);
    path_00._M_string_length = in_stack_fffffffffffffe30;
    path_00._M_dataplus._M_p = in_stack_fffffffffffffe28._M_p;
    path_00.field_2._M_allocated_capacity = in_stack_fffffffffffffe38;
    path_00.field_2._8_8_ = in_stack_fffffffffffffe40;
    readFileContents(&local_1b8,path_00);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    if (local_1b8._M_string_length == 0) {
      lVar2 = llb_buildsystem_command_result_failed;
    }
    else {
      local_f8._M_allocated_capacity = (size_type)(string *)local_e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_108 + 0x10),local_178,(long)local_178 + local_170);
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,local_1b8._M_dataplus._M_p,
                 local_1b8._M_dataplus._M_p + local_1b8._M_string_length);
      path_01._M_string_length = in_stack_fffffffffffffe30;
      path_01._M_dataplus._M_p = in_stack_fffffffffffffe28._M_p;
      path_01.field_2._M_allocated_capacity = in_stack_fffffffffffffe38;
      path_01.field_2._8_8_ = in_stack_fffffffffffffe40;
      writeFileContents(path_01,(string *)local_f8._M_allocated_capacity);
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      if ((string *)local_f8._M_allocated_capacity != (string *)local_e8) {
        operator_delete((void *)local_f8._M_allocated_capacity,(ulong)(local_e8._0_8_ + 1));
      }
      local_150 = 0;
      local_148 = 0;
      local_158 = &local_148;
      std::__cxx11::string::append((char *)&local_158,0x1dd4f2);
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"version","");
      std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_b0[0]);
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0],local_a0[0] + 1);
      }
      std::__cxx11::string::append((char *)&local_158,0x1dd4f2);
      std::__cxx11::string::append((char *)&local_158);
      std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_138);
      std::__cxx11::string::append((char *)&local_158,0x1dd4f2);
      std::__cxx11::string::append((char *)&local_158);
      std::__cxx11::string::_M_append((char *)&local_158,(ulong)in_stack_fffffffffffffe28._M_p);
      std::__cxx11::string::append((char *)&local_158,0x1dd4f2);
      local_118[0] = (string *)local_108;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_118,local_198,(long)local_198 + local_190);
      local_d8._8_8_ = local_c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_d8 + 8),local_158,local_158 + local_150);
      path_02._M_string_length = in_stack_fffffffffffffe30;
      path_02._M_dataplus._M_p = in_stack_fffffffffffffe28._M_p;
      path_02.field_2._M_allocated_capacity = in_stack_fffffffffffffe38;
      path_02.field_2._8_8_ = in_stack_fffffffffffffe40;
      writeFileContents(path_02,local_118[0]);
      if ((long *)local_d8._8_8_ != local_c0) {
        operator_delete((void *)local_d8._8_8_,local_c0[0] + 1);
      }
      if (local_118[0] != (string *)local_108) {
        operator_delete(local_118[0],(ulong)(local_108._0_8_ + 1));
      }
      llb_free(ptr_00);
      if (local_158 != &local_148) {
        operator_delete(local_158,CONCAT71(uStack_147,local_148) + 1);
      }
      lVar2 = llb_buildsystem_command_result_succeeded;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
  }
  if (in_stack_fffffffffffffe28._M_p != &stack0xfffffffffffffe38) {
    operator_delete(in_stack_fffffffffffffe28._M_p,in_stack_fffffffffffffe38 + 1);
  }
  if (local_198 != local_188) {
    operator_delete(local_198,local_188[0] + 1);
  }
  if (local_178 != local_168) {
    operator_delete(local_178,local_168[0] + 1);
  }
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  return lVar2;
}

Assistant:

static llb_buildsystem_command_result_t
depinfo_tester_command_execute_command(void *context,
                                       llb_buildsystem_command_t* command,
                                       llb_buildsystem_interface_t* bi,
                                       llb_task_interface_t ti,
                                       llb_buildsystem_queue_job_context_t* job) {
  // The tester tool is given a direct input file whose only contents are the
  // path of another, indirect input file.  It is also given the paths to which
  // it should emit the output file and an ld-style dependency-info file.  It
  // copies the indirect input file to the output file, and creates the depinfo
  // file, recording the direct and indirect input files as input dependencies.
  
  // Because the llb_buildsystem_* API doesn't seem to currently give us access
  // to the command inputs and outputs, and because extending it to do so would
  // be beyond the scope of the change being tested here, we encode the paths of
  // the input, output, and dep-info files in the command the description, which
  // we can access using llb_buildsystem_* calls.
  
  // So we get the description, which is all we have access to, and rely on the
  // use of the pipe character as a record separator in the unit test manifest.
  // llb_buildsystem_command_get_description() function is documented to return
  // a mutable copy that we then have to free, so we're free to modify it.
  char * desc = llb_buildsystem_command_get_description(command);
  char * ptr = desc;
  llbuild::basic::sys::strsep(&ptr, "|"); // skip over rule name
  std::string directInputPath = llbuild::basic::sys::strsep(&ptr, "|");
  puts(directInputPath.c_str());
  std::string outputPath = llbuild::basic::sys::strsep(&ptr, "|");
  puts(outputPath.c_str());
  std::string depInfoPath = llbuild::basic::sys::strsep(&ptr, "|");
  puts(depInfoPath.c_str());
  
  // Read the absolute path of the indirect input from the direct input.
  std::string indirectInputPath = readFileContents(directInputPath);
  if (indirectInputPath.empty()) {
    return llb_buildsystem_command_result_failed;
  }
  
  // Read the contents of the indirect input.
  std::string indirectContents = readFileContents(indirectInputPath);
  if (indirectContents.empty()) {
    return llb_buildsystem_command_result_failed;
  }
  
  // Write the contents of the indirect input to the output.
  writeFileContents(outputPath, indirectContents);
  
  // Write out the ld-style dependency info file, which consists of a sequence
  // of records.  Each record consists of a type byte followed by a C string
  // (i.e. null-terminated).  Type zero is an information string about the tool
  // that produced the dep-info file (commonly containing its name and version)
  // and type 0x10 is plain input file.
  std::string depInfoContents;
  depInfoContents.append("\0", 1);
  depInfoContents.append(std::string("version"));
  depInfoContents.append("\0", 1);
  depInfoContents.append("\020");
  depInfoContents.append(directInputPath);
  depInfoContents.append("\0", 1);
  depInfoContents.append("\020");
  depInfoContents.append(indirectInputPath);
  depInfoContents.append("\0", 1);
  writeFileContents(depInfoPath, depInfoContents);

  // Clean up.
  llb_free(desc);
  return llb_buildsystem_command_result_succeeded;
}